

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntegerInductionLiteralStrictness>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntegerInductionLiteralStrictness>_>_>
* __thiscall
Lib::
Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntegerInductionLiteralStrictness>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntegerInductionLiteralStrictness>_>_>_>
::RefIterator::next(RefIterator *this)

{
  RefIterator *this_local;
  
  this->_pointer = this->_pointer + -1;
  return this->_pointer;
}

Assistant:

inline
    C& next()
    {
      ASS(_pointer > _stack._stack);
      ASS(_last == 2);
#if VDEBUG
      _last = 1;
#endif

      _pointer--;
      return *_pointer;
    }